

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_includes(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  bool bVar1;
  int iVar2;
  BOOL BVar3;
  JSValueUnion JVar4;
  int64_t iVar5;
  uint uVar6;
  ulong uVar7;
  JSValueUnion JVar8;
  int64_t *piVar9;
  ulong uVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue JVar13;
  int64_t len;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  JVar11 = JS_ToObject(ctx,this_val);
  JVar8 = (JSValueUnion)JVar11.tag;
  JVar4 = JVar11.u;
  iVar2 = js_get_length64(ctx,(int64_t *)&local_38,JVar11);
  uVar6 = (uint)JVar11.tag;
  uVar10 = local_50;
  if (iVar2 == 0) {
    local_40 = local_38;
    if ((long)local_38 < 1) {
      JVar8.float64 = 0.0;
      uVar7 = local_50;
    }
    else {
      local_50 = 0;
      if (1 < argc) {
        JVar8 = (JSValueUnion)argv[1].tag;
        iVar2 = JS_ToInt64Clamp(ctx,(int64_t *)&local_50,argv[1],0,local_38,local_38);
        uVar10 = local_50;
        if (iVar2 != 0) goto LAB_0012ee04;
      }
      bVar1 = true;
      if (((uVar6 == 0xffffffff) && (JVar8 = JVar4, *(short *)((long)JVar4.ptr + 6) == 2)) &&
         ((*(byte *)((long)JVar4.ptr + 5) & 8) != 0)) {
        local_48 = (ulong)*(uint *)((long)JVar4.ptr + 0x40);
        JVar8 = (JSValueUnion)((JSValueUnion *)((long)JVar4.ptr + 0x38))->ptr;
        bVar1 = false;
      }
      else {
        local_48 = 0;
      }
      uVar10 = local_50;
      if ((!bVar1) && ((long)local_50 < (long)local_48)) {
        piVar9 = (int64_t *)((long)JVar8.ptr + local_50 * 0x10 + 8);
        uVar7 = local_50;
        do {
          JVar12 = *argv;
          if (0xfffffff4 < (uint)argv->tag) {
            *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
          }
          JVar8 = (JSValueUnion)((JSValueUnion *)(piVar9 + -1))->ptr;
          iVar5 = *piVar9;
          if (0xfffffff4 < (uint)iVar5) {
            *(int *)JVar8.ptr = *JVar8.ptr + 1;
          }
          JVar13.tag = iVar5;
          JVar13.u.ptr = JVar8.ptr;
          BVar3 = js_strict_eq2(ctx,JVar12,JVar13,JS_EQ_SAME_VALUE_ZERO);
          if (BVar3 != 0) {
            JVar8.float64 = 4.94065645841247e-324;
            goto LAB_0012efb4;
          }
          uVar7 = uVar7 + 1;
          piVar9 = piVar9 + 2;
          uVar10 = local_48;
        } while (local_48 != uVar7);
      }
      local_50 = uVar10;
      if ((long)local_50 < (long)local_40) {
        JVar8.float64 = 0.0;
        uVar10 = local_50;
        do {
          JVar12 = JS_GetPropertyInt64(ctx,JVar11,uVar10);
          if ((int)JVar12.tag == 6) goto LAB_0012ee04;
          JVar13 = *argv;
          if (0xfffffff4 < (uint)argv->tag) {
            *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
          }
          BVar3 = js_strict_eq2(ctx,JVar13,JVar12,JS_EQ_SAME_VALUE_ZERO);
          if (BVar3 != 0) {
            JVar8.float64 = 4.94065645841247e-324;
            uVar7 = uVar10;
            break;
          }
          uVar10 = uVar10 + 1;
          uVar7 = local_40;
        } while (local_40 != uVar10);
      }
      else {
        JVar8.float64 = 0.0;
        uVar7 = local_50;
      }
    }
LAB_0012efb4:
    local_50 = uVar7;
    if ((0xfffffff4 < uVar6) && (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar11);
    }
    iVar5 = 1;
  }
  else {
LAB_0012ee04:
    local_50 = uVar10;
    if ((0xfffffff4 < uVar6) && (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar11);
    }
    iVar5 = 6;
    JVar8.float64 = 0.0;
  }
  JVar11.tag = iVar5;
  JVar11.u.float64 = JVar8.float64;
  return JVar11;
}

Assistant:

static JSValue js_array_includes(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue obj, val;
    int64_t len, n, res;
    JSValue *arrp;
    uint32_t count;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    res = FALSE;
    if (len > 0) {
        n = 0;
        if (argc > 1) {
            if (JS_ToInt64Clamp(ctx, &n, argv[1], 0, len, len))
                goto exception;
        }
        if (js_get_fast_array(ctx, obj, &arrp, &count)) {
            for (; n < count; n++) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]),
                                  JS_DupValue(ctx, arrp[n]),
                                  JS_EQ_SAME_VALUE_ZERO)) {
                    res = TRUE;
                    goto done;
                }
            }
        }
        for (; n < len; n++) {
            val = JS_GetPropertyInt64(ctx, obj, n);
            if (JS_IsException(val))
                goto exception;
            if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]), val,
                              JS_EQ_SAME_VALUE_ZERO)) {
                res = TRUE;
                break;
            }
        }
    }
 done:
    JS_FreeValue(ctx, obj);
    return JS_NewBool(ctx, res);

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}